

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_election_timeout(raft_server *this)

{
  __int_type_conflict1 _Var1;
  element_type *peVar2;
  long *plVar3;
  element_type *peVar4;
  __int_type _Var5;
  int iVar6;
  int32 iVar7;
  uint64_t uVar8;
  srv_role _role;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  bool bVar12;
  string local_a0;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [16];
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_50 [32];
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 5 < iVar6)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_a0,"election timeout");
    (*peVar2->_vptr_logger[8])
              (peVar2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
               ,"handle_election_timeout",0xc9,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  guard._M_device = &this->lock_;
  guard._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&guard);
  guard._M_owns = true;
  if (((this->stopping_)._M_base._M_i & 1U) == 0) {
    if (this->steps_to_down_ < 1) {
      if (((this->catching_up_)._M_base._M_i & 1U) == 0) {
        if (((this->out_of_log_range_)._M_base._M_i & 1U) != 0) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 == (element_type *)0x0) || (iVar6 = (*peVar2->_vptr_logger[7])(), iVar6 < 3))
          goto LAB_0018e1f1;
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"Triggered election timer but server is out of log range");
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xfd,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0018e1f1;
          goto LAB_0018e040;
        }
        if ((((this->receiving_snapshot_)._M_base._M_i & 1U) == 0) ||
           (0x13 < (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i)) {
          uVar8 = timer_helper::get_us(&this->last_election_timer_reset_);
          _Var1 = (this->serving_req_)._M_base._M_i;
          bVar12 = true;
          if ((_Var1 & 1U) == 0) {
            context::get_params((context *)local_70);
            bVar12 = (int)(uVar8 / 1000) < *(int *)((long)(_func_int ***)local_70._0_8_ + 4);
          }
          if (((_Var1 & 1U) == 0) &&
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
          if (bVar12) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)
               ) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        (&local_a0,"election timeout while serving append entries, ignore it.");
              (*peVar2->_vptr_logger[8])
                        (peVar2,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_election_timeout",0x111,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
            }
          }
          else {
            if ((this->role_)._M_i == leader) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 == (element_type *)0x0) ||
                 (iVar6 = (*peVar2->_vptr_logger[7])(), iVar6 < 2)) goto LAB_0018e1f1;
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        (&local_a0,
                         "A leader should never encounter election timeout, illegal application state, ignore it."
                        );
              (*peVar2->_vptr_logger[8])
                        (peVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_election_timeout",0x118,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0018e1f1;
              goto LAB_0018e040;
            }
            if (this->im_learner_ == false) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 != (element_type *)0x0) &&
                 (iVar6 = (*peVar2->_vptr_logger[7])(), 2 < iVar6)) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                msg_if_given_abi_cxx11_(&local_a0,"Election timeout, initiate leader election");
                (*peVar2->_vptr_logger[8])
                          (peVar2,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_election_timeout",0x11e,&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
              }
              if (((this->hb_alive_)._M_base._M_i & 1U) == 0) {
                decay_target_priority(this);
              }
              peVar4 = (this->log_store_).
                       super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar4 == (element_type *)0x0) {
                bVar12 = false;
              }
              else {
                (*peVar4->_vptr_log_store[4])(&local_80);
                bVar12 = local_80 != 0;
                if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
                }
              }
              if (bVar12) {
                (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[4])(&local_a0);
                uVar11 = *(undefined8 *)local_a0._M_dataplus._M_p;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_a0._M_string_length);
                }
              }
              else {
                uVar11 = 0;
              }
              _Var5 = (((this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      term_).super___atomic_base<unsigned_long>._M_i;
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 != (element_type *)0x0) &&
                 (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                srv_role_to_string_abi_cxx11_
                          ((string *)local_50,(nuraft *)(ulong)(this->role_)._M_i,_role);
                pcVar9 = "hb dead";
                if (((this->hb_alive_)._M_base._M_i & 1U) != 0) {
                  pcVar9 = "hb alive";
                }
                pcVar10 = "pre-vote NOT done";
                if (((this->pre_vote_).done_._M_base._M_i & 1U) != 0) {
                  pcVar10 = "pre-vote done";
                }
                msg_if_given_abi_cxx11_
                          (&local_a0,
                           "[ELECTION TIMEOUT] current role: %s, log last term %lu, state term %lu, target p %d, my p %d, %s, %s"
                           ,local_50._0_8_,uVar11,_Var5,(ulong)(uint)this->target_priority_,
                           (ulong)(uint)this->my_priority_,pcVar9,pcVar10);
                (*peVar2->_vptr_logger[8])
                          (peVar2,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_election_timeout",0x130,&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
                if ((element_type *)local_50._0_8_ != (element_type *)(local_50 + 0x10)) {
                  operator_delete((void *)local_50._0_8_);
                }
              }
              if ((this->pre_vote_).term_ != _Var5) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                if ((peVar2 != (element_type *)0x0) &&
                   (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)) {
                  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  msg_if_given_abi_cxx11_
                            (&local_a0,"pre-vote term (%lu) is different, reset it to %lu",
                             (this->pre_vote_).term_,_Var5);
                  (*peVar2->_vptr_logger[8])
                            (peVar2,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                             ,"handle_election_timeout",0x135,&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p);
                  }
                }
                (this->pre_vote_).term_ = _Var5;
                LOCK();
                (this->pre_vote_).done_._M_base._M_i = false;
                UNLOCK();
                LOCK();
                (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
                UNLOCK();
                LOCK();
                (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
                UNLOCK();
                LOCK();
                (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
                UNLOCK();
              }
              if ((((this->peers_)._M_h._M_element_count == 0) ||
                  (((this->pre_vote_).done_._M_base._M_i & 1U) != 0)) ||
                 (iVar7 = get_quorum_for_election(this), iVar7 == 0)) {
                initiate_vote(this,false);
              }
              else {
                request_prevote(this);
              }
            }
            if ((this->role_)._M_i == leader) goto LAB_0018e1f1;
          }
          restart_election_timer(this);
          goto LAB_0018e1f1;
        }
        LOCK();
        (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i =
             (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 2 < iVar6)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"election timeout while receiving snapshot, count %lu, ignore it.",
                     (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i);
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0x106,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_0018e150;
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"election timeout while joining the cluster, ignore it.");
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xf7,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_0018e150;
        }
      }
    }
    else {
      iVar6 = this->steps_to_down_ + -1;
      this->steps_to_down_ = iVar6;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (iVar6 == 0) {
        if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,
                     "no hearing further news from leader, remove this server from cluster and step down"
                    );
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_election_timeout",0xd3,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
        }
        LOCK();
        (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        election_timer_allowed_)._M_base._M_i = false;
        UNLOCK();
        plVar3 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar3 + 0x20))
                  (plVar3,(this->state_).
                          super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        cancel_schedulers(this);
        goto LAB_0018e1f1;
      }
      if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 3 < iVar6)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_a0,"stepping down (cycles left: %d), skip this election timeout event",
                   (ulong)(uint)this->steps_to_down_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_election_timeout",0xef,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_0018e150:
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
    }
    restart_election_timer(this);
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 == (element_type *)0x0) || (iVar6 = (*peVar2->_vptr_logger[7])(), iVar6 < 3))
    goto LAB_0018e1f1;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_a0,"Triggered election timer but server is shutting down");
    (*peVar2->_vptr_logger[8])
              (peVar2,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
               ,"handle_election_timeout",0xcc,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0018e1f1;
LAB_0018e040:
    operator_delete(local_a0._M_dataplus._M_p);
  }
LAB_0018e1f1:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::handle_election_timeout() {
    p_tr("election timeout");
    recur_lock(lock_);
    if (stopping_) {
        p_wn("Triggered election timer but server is shutting down");
        return;
    }

    if (steps_to_down_ > 0) {
        if (--steps_to_down_ == 0) {
            p_in("no hearing further news from leader, "
                 "remove this server from cluster and step down");
            // Modified by Jung-Sang Ahn (Oct 25, 2017):
            // Should maintain the info of itself in the config,
            // for the next launch.
            /*
            for ( std::list<ptr<srv_config>>::iterator it =
                      config_->get_servers().begin();
                  it != config_->get_servers().end();
                  ++it ) {
                if ((*it)->get_id() == id_) {
                    config_->get_servers().erase(it);
                    ctx_->state_mgr_->save_config(*config_);
                    break;
                }
            }
            */
            state_->allow_election_timer(false);
            ctx_->state_mgr_->save_state(*state_);

            // Modified by Jung-Sang Ahn (Dec 24, 2019):
            // Same as in reconfigure().
            //reset_peer_info();
            cancel_schedulers();
            return;
        }

        p_in( "stepping down (cycles left: %d), "
              "skip this election timeout event",
              steps_to_down_ );
        restart_election_timer();
        return;
    }

    if (catching_up_) {
        // this is a new server for the cluster, will not send out vote req
        // until conf that includes this srv is committed
        p_in("election timeout while joining the cluster, ignore it.");
        restart_election_timer();
        return;
    }

    if (out_of_log_range_) {
        p_wn("Triggered election timer but server is out of log range");
        return;
    }

    if (receiving_snapshot_ && et_cnt_receiving_snapshot_ < 20) {
        // If this node is receiving snapshot,
        // ignore election timeout 20 times.
        et_cnt_receiving_snapshot_.fetch_add(1);
        p_wn("election timeout while receiving snapshot, count %" PRIu64 ", "
             "ignore it.", et_cnt_receiving_snapshot_.load());
        restart_election_timer();
        return;
    }

    int time_ms = last_election_timer_reset_.get_us() / 1000;
    if ( serving_req_ ||
         time_ms < ctx_->get_params()->election_timeout_lower_bound_ ) {
        // Handling appending entries is now taking long time,
        // so that server keeps skipping sending heartbeat.
        // It doesn't mean server is gone. Just ignore.
        p_in("election timeout while serving append entries, ignore it.");
        restart_election_timer();
        return;
    }

    if (role_ == srv_role::leader) {
        p_er( "A leader should never encounter election timeout, "
              "illegal application state, ignore it.");
        return;
    }

    // Only voting member can suggest vote.
    if (!im_learner_) {
        p_wn("Election timeout, initiate leader election");
        if (!hb_alive_) {
            // Not the first election timeout, decay the target priority.
            decay_target_priority();
        }

        ulong last_log_term = 0;
        if (log_store_ && log_store_->last_entry()) {
            last_log_term = log_store_->last_entry()->get_term();
        }

        ulong state_term = state_->get_term();

        p_in( "[ELECTION TIMEOUT] current role: %s, log last term %" PRIu64 ", "
              "state term %" PRIu64 ", target p %d, my p %d, %s, %s",
              srv_role_to_string(role_).c_str(), last_log_term, state_term,
              target_priority_, my_priority_,
              (hb_alive_) ? "hb alive" : "hb dead",
              (pre_vote_.done_) ? "pre-vote done" : "pre-vote NOT done");

        // `term` changed, cannot use previous pre-vote result.
        if (pre_vote_.term_ != state_term) {
            p_in("pre-vote term (%" PRIu64 ") is different, reset it to %" PRIu64 "",
                 pre_vote_.term_, state_term);
            pre_vote_.reset(state_term);
        }

        if ( !peers_.size() ||
             pre_vote_.done_ ||
             get_quorum_for_election() == 0 ) {
            initiate_vote();
        } else {
            request_prevote();
        }

    }

    // restart the election timer if this is not yet a leader
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }
}